

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar3 = _DAT_00105050;
  auVar8 = _DAT_00105040;
  if (nvec < 1) {
    return -1;
  }
  lVar1 = *(*Z)->content;
  if (nvec == 1) {
    if (0 < lVar1) {
      lVar2 = *(long *)((long)(*Z)->content + 0x10);
      lVar4 = lVar1 + -1;
      auVar7._8_4_ = (int)lVar4;
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar5 = 0;
      auVar7 = auVar7 ^ _DAT_00105050;
      do {
        auVar9 = auVar8 ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                    auVar7._4_4_ < auVar9._4_4_) & 1)) {
          *(realtype *)(lVar2 + uVar5 * 8) = c;
        }
        if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
            auVar9._12_4_ <= auVar7._12_4_) {
          *(realtype *)(lVar2 + 8 + uVar5 * 8) = c;
        }
        uVar5 = uVar5 + 2;
        lVar4 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar4 + 2;
      } while ((lVar1 + 1U & 0xfffffffffffffffe) != uVar5);
    }
  }
  else {
    lVar2 = lVar1 + -1;
    auVar9._8_4_ = (int)lVar2;
    auVar9._0_8_ = lVar2;
    auVar9._12_4_ = (int)((ulong)lVar2 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_00105050;
    do {
      if (0 < lVar1) {
        lVar2 = *(long *)((long)Z[uVar5]->content + 0x10);
        uVar6 = 0;
        auVar10 = auVar8;
        do {
          auVar7 = auVar10 ^ auVar3;
          if ((bool)(~(auVar9._4_4_ < auVar7._4_4_ ||
                      auVar9._0_4_ < auVar7._0_4_ && auVar7._4_4_ == auVar9._4_4_) & 1)) {
            *(realtype *)(lVar2 + uVar6 * 8) = c;
          }
          if (auVar7._12_4_ <= auVar9._12_4_ &&
              (auVar7._8_4_ <= auVar9._8_4_ || auVar7._12_4_ != auVar9._12_4_)) {
            *(realtype *)(lVar2 + 8 + uVar6 * 8) = c;
          }
          uVar6 = uVar6 + 2;
          lVar4 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar4 + 2;
        } while ((lVar1 + 1U & 0xfffffffffffffffe) != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nvec);
  }
  return 0;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}